

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

void string_buffer_append_string(string_buffer_t *sb,char *str)

{
  int iVar1;
  size_t __n;
  char *__ptr;
  size_t sVar2;
  ulong uVar3;
  
  if (sb == (string_buffer_t *)0x0) {
    __assert_fail("sb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x18c,"void string_buffer_append_string(string_buffer_t *, const char *)");
  }
  if (str != (char *)0x0) {
    __n = strlen(str);
    __ptr = sb->s;
    sVar2 = sb->size;
    uVar3 = (ulong)sb->alloc;
    if (uVar3 <= __n + sVar2 + 1) {
      do {
        iVar1 = (int)uVar3 * 2;
        sb->alloc = iVar1;
        __ptr = (char *)realloc(__ptr,(long)iVar1);
        sb->s = __ptr;
        sVar2 = sb->size;
        uVar3 = (ulong)sb->alloc;
      } while (uVar3 <= __n + 1 + sVar2);
    }
    memcpy(__ptr + sVar2,str,__n);
    sVar2 = sb->size + __n;
    sb->size = sVar2;
    sb->s[sVar2] = '\0';
    return;
  }
  __assert_fail("str != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x18d,"void string_buffer_append_string(string_buffer_t *, const char *)");
}

Assistant:

void string_buffer_append_string(string_buffer_t *sb, const char *str)
{
    assert(sb != NULL);
    assert(str != NULL);

    size_t len = strlen(str);

    while (sb->size+len + 1 >= sb->alloc) {
        sb->alloc *= 2;
        sb->s = realloc(sb->s, sb->alloc);
    }

    memcpy(&sb->s[sb->size], str, len);
    sb->size += len;
    sb->s[sb->size] = 0;
}